

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::PrepareCommandPool
          (DeviceContextVkImpl *this,SoftwareQueueIndex CommandQueueId)

{
  undefined8 this_00;
  bool bVar1;
  COMMAND_QUEUE_TYPE CVar2;
  Uint32 UVar3;
  uint Value;
  RenderDeviceVkImpl *pRVar4;
  size_t sVar5;
  Char *pCVar6;
  ICommandQueueVk *pIVar7;
  VulkanPhysicalDevice *this_01;
  size_type sVar8;
  pointer pVVar9;
  const_reference pvVar10;
  VkQueueFamilyProperties *QueueInfo;
  undefined1 local_90 [24];
  unique_ptr *local_78;
  unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>
  *Pool;
  string msg_1;
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> *QueueProps;
  HardwareQueueIndex QueueFamilyIndex;
  undefined1 local_38 [8];
  string msg;
  DeviceContextVkImpl *this_local;
  SoftwareQueueIndex CommandQueueId_local;
  
  msg.field_2._8_8_ = this;
  this_local._7_1_ = CommandQueueId.m_Value;
  UVar3 = IndexWrapper::operator_cast_to_unsigned_int((IndexWrapper *)((long)&this_local + 7));
  pRVar4 = RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator->
                     (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                       super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice);
  sVar5 = RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
          ::GetCommandQueueCount
                    (&pRVar4->
                      super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                    );
  if (sVar5 <= UVar3) {
    FormatString<char[31]>((string *)local_38,(char (*) [31])"CommandQueueId is out of range");
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"PrepareCommandPool",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xb1);
    std::__cxx11::string::~string((string *)local_38);
  }
  pRVar4 = RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator->
                     (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                       super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice);
  QueueProps._2_1_ = this_local._7_1_;
  pIVar7 = RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
           ::GetCommandQueue(&pRVar4->
                              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                             ,this_local._7_1_);
  Value = (*(pIVar7->super_ICommandQueue).super_IObject._vptr_IObject[0xc])();
  IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>::
  IndexWrapper<unsigned_int,unsigned_int>
            ((IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag> *)((long)&QueueProps + 3)
             ,Value);
  pRVar4 = RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator->
                     (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                       super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice);
  this_01 = RenderDeviceVkImpl::GetPhysicalDevice(pRVar4);
  msg_1.field_2._8_8_ = VulkanUtilities::VulkanPhysicalDevice::GetQueueProperties(this_01);
  UVar3 = IndexWrapper::operator_cast_to_unsigned_int((IndexWrapper *)((long)&QueueProps + 3));
  sVar8 = std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::size
                    ((vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> *)
                     msg_1.field_2._8_8_);
  if (sVar8 <= UVar3) {
    FormatString<char[33]>((string *)&Pool,(char (*) [33])"QueueFamilyIndex is out of range");
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"PrepareCommandPool",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xb5);
    std::__cxx11::string::~string((string *)&Pool);
  }
  UVar3 = IndexWrapper::operator_cast_to_unsigned_int((IndexWrapper *)((long)&QueueProps + 3));
  local_78 = (unique_ptr *)
             std::
             unique_ptr<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>[],_std::default_delete<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>[]>_>
             ::operator[](&this->m_QueueFamilyCmdPools,(ulong)UVar3);
  bVar1 = std::unique_ptr::operator_cast_to_bool(local_78);
  if (!bVar1) {
    pRVar4 = RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator->
                       (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice);
    RenderDeviceVkImpl::GetLogicalDevice(pRVar4);
    VulkanUtilities::VulkanLogicalDevice::GetSharedPtr((VulkanLogicalDevice *)local_90);
    std::
    make_unique<VulkanUtilities::VulkanCommandBufferPool,std::shared_ptr<VulkanUtilities::VulkanLogicalDevice_const>,Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>const&,int>
              ((shared_ptr<const_VulkanUtilities::VulkanLogicalDevice> *)(local_90 + 0x10),
               (IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag> *)local_90,
               (int *)((long)&QueueProps + 3));
    std::
    unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>
    ::operator=((unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>
                 *)local_78,
                (unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>
                 *)(local_90 + 0x10));
    std::
    unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>
    ::~unique_ptr((unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>
                   *)(local_90 + 0x10));
    std::shared_ptr<const_VulkanUtilities::VulkanLogicalDevice>::~shared_ptr
              ((shared_ptr<const_VulkanUtilities::VulkanLogicalDevice> *)local_90);
  }
  pVVar9 = std::
           unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>
           ::get((unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>
                  *)local_78);
  this_00 = msg_1.field_2._8_8_;
  this->m_CmdPool = pVVar9;
  UVar3 = IndexWrapper::operator_cast_to_unsigned_int((IndexWrapper *)((long)&QueueProps + 3));
  pvVar10 = std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::
            operator[]((vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> *)
                       this_00,(ulong)UVar3);
  UVar3 = IndexWrapper::operator_cast_to_unsigned_int((IndexWrapper *)((long)&QueueProps + 3));
  (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
  super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.QueueId = (Uint8)UVar3;
  CVar2 = VkQueueFlagsToCmdQueueType(pvVar10->queueFlags);
  (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
  super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.QueueType = CVar2;
  (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
  super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.TextureCopyGranularity[0] =
       (pvVar10->minImageTransferGranularity).width;
  (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
  super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.TextureCopyGranularity[1] =
       (pvVar10->minImageTransferGranularity).height;
  (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
  super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.TextureCopyGranularity[2] =
       (pvVar10->minImageTransferGranularity).depth;
  return;
}

Assistant:

void DeviceContextVkImpl::PrepareCommandPool(SoftwareQueueIndex CommandQueueId)
{
    DEV_CHECK_ERR(CommandQueueId < m_pDevice->GetCommandQueueCount(), "CommandQueueId is out of range");

    const HardwareQueueIndex QueueFamilyIndex{m_pDevice->GetCommandQueue(CommandQueueId).GetQueueFamilyIndex()};
    const auto&              QueueProps = m_pDevice->GetPhysicalDevice().GetQueueProperties();
    DEV_CHECK_ERR(QueueFamilyIndex < QueueProps.size(), "QueueFamilyIndex is out of range");

    std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool>& Pool = m_QueueFamilyCmdPools[QueueFamilyIndex];
    if (!Pool)
    {
        // Command pools must be thread-safe because command buffers are returned into pools by release queues
        // potentially running in another thread
        Pool = std::make_unique<VulkanUtilities::VulkanCommandBufferPool>(
            m_pDevice->GetLogicalDevice().GetSharedPtr(),
            QueueFamilyIndex,
            VK_COMMAND_POOL_CREATE_TRANSIENT_BIT | VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT);
    }
    m_CmdPool = Pool.get();

    // Set queue properties
    const VkQueueFamilyProperties& QueueInfo{QueueProps[QueueFamilyIndex]};
    m_Desc.QueueId                   = static_cast<Uint8>(QueueFamilyIndex);
    m_Desc.QueueType                 = VkQueueFlagsToCmdQueueType(QueueInfo.queueFlags);
    m_Desc.TextureCopyGranularity[0] = QueueInfo.minImageTransferGranularity.width;
    m_Desc.TextureCopyGranularity[1] = QueueInfo.minImageTransferGranularity.height;
    m_Desc.TextureCopyGranularity[2] = QueueInfo.minImageTransferGranularity.depth;
}